

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O0

bool __thiscall cmCPackExternalGenerator::StagingEnabled(cmCPackExternalGenerator *this)

{
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  cmValue local_18;
  cmCPackExternalGenerator *local_10;
  cmCPackExternalGenerator *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CPACK_EXTERNAL_ENABLE_STAGING",&local_39);
  local_18 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_38);
  bVar1 = cmValue::IsOff(&local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool cmCPackExternalGenerator::StagingEnabled() const
{
  return !this->GetOption("CPACK_EXTERNAL_ENABLE_STAGING").IsOff();
}